

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatements
          (cmNinjaTargetGenerator *this,string *config,string *fileConfig,bool firstForConfig)

{
  pointer pcVar1;
  cmOSXBundleGenerator *pcVar2;
  cmMakefile *pcVar3;
  cmGeneratorTarget *pcVar4;
  _Base_ptr p_Var5;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  undefined8 uVar6;
  undefined8 uVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  TargetType targetType;
  PolicyStatus PVar13;
  cmGlobalNinjaGenerator *pcVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar15;
  ostream *poVar16;
  mapped_type *pmVar17;
  cmValue cVar18;
  string *psVar19;
  cmGlobalNinjaGenerator *pcVar20;
  string *psVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar23;
  cmSourceFile *pcVar24;
  cmFileSet *pcVar25;
  MapToNinjaPathImpl MVar26;
  ulong uVar27;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var28;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  const_iterator cVar29;
  vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
  *this_00;
  undefined4 extraout_var_03;
  _Base_ptr p_Var30;
  undefined4 extraout_var_04;
  undefined7 in_register_00000009;
  _Rb_tree_node_base *p_Var31;
  iterator it;
  long lVar32;
  iterator iVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  pointer pbVar35;
  cmCustomCommand *pcVar36;
  pointer ppcVar37;
  pointer ppcVar38;
  _Base_ptr __x;
  _Base_ptr p_Var39;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  basic_string_view<char,_std::char_traits<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ccouts;
  cmSourceFile *sf;
  string tgtDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ccouts_private;
  vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_> customCommands;
  cmCustomCommand *cc;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommandSources;
  cmNinjaTargetGenerator *pcVar40;
  cmNinjaTargetGenerator *pcVar41;
  undefined1 local_4d8 [40];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
  *local_4b0;
  undefined1 local_4a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490 [2];
  _Rb_tree_node_base *local_470;
  undefined1 local_468 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  _Rb_tree_node_base *local_430;
  undefined1 local_428 [32];
  _Rb_tree_node_base *local_408;
  iterator iStack_400;
  cmCustomCommand **local_3f8;
  undefined4 local_3ec;
  undefined1 local_3e8 [32];
  _Alloc_hider local_3c8;
  size_type local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  pointer local_398;
  pointer local_390;
  pointer local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  pointer local_378;
  _Base_ptr local_370;
  pointer local_368;
  pointer local_360;
  pointer local_358;
  pointer local_350;
  pointer local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  iterator local_328;
  _Rb_tree_node_base local_310;
  size_t local_2f0;
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined1 local_2c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  undefined1 local_298 [8];
  undefined1 auStack_290 [16];
  _Alloc_hider local_280;
  pointer local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  cmLocalGenerator *local_260;
  pointer local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_228 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  iterator local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [5];
  key_type local_168;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_148;
  bool local_128;
  undefined1 local_120 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Rb_tree_node_base *local_e0;
  string local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  code *local_48;
  undefined8 uStack_40;
  
  cmGeneratorTarget::CheckCxxModuleStatus
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  iVar12 = (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x45])(pcVar14,fileConfig);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)CONCAT44(extraout_var,iVar12));
  pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  iVar12 = (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x45])(pcVar14,fileConfig);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT44(extraout_var_00,iVar12),"# Object build statements for ",0x1e);
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  psVar15 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)CONCAT44(extraout_var_00,iVar12),(psVar15->_M_dataplus)._M_p,
                       psVar15->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," target ",8);
  psVar15 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_2c8._0_8_ = local_2c8 + 0x10;
  pcVar1 = (psVar15->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2c8,pcVar1,pcVar1 + psVar15->_M_string_length);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,(char *)local_2c8._0_8_,local_2c8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n\n",2);
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  local_3f8 = (cmCustomCommand **)0x0;
  local_408 = (_Rb_tree_node_base *)0x0;
  iStack_400._M_current = (cmCustomCommand **)0x0;
  local_2c8._16_8_ = (pointer)0x0;
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_8_ = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_2c8,config
            );
  uVar6 = local_2c8._8_8_;
  if (local_2c8._0_8_ != local_2c8._8_8_) {
    ppcVar38 = (pointer)local_2c8._0_8_;
    do {
      local_3e8._0_8_ = cmSourceFile::GetCustomCommand(*ppcVar38);
      cmLocalNinjaGenerator::AddCustomCommandTarget
                (this->LocalGenerator,(cmCustomCommand *)local_3e8._0_8_,
                 (this->super_cmCommonTargetGenerator).GeneratorTarget);
      if (iStack_400._M_current == local_3f8) {
        std::vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>>::
        _M_realloc_insert<cmCustomCommand_const*const&>
                  ((vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>> *)
                   &local_408,iStack_400,(cmCustomCommand **)local_3e8);
      }
      else {
        *iStack_400._M_current = (cmCustomCommand *)local_3e8._0_8_;
        iStack_400._M_current = iStack_400._M_current + 1;
      }
      ppcVar38 = ppcVar38 + 1;
    } while (ppcVar38 != (pointer)uVar6);
  }
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ - local_2c8._0_8_);
  }
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_8_ = (pointer)0x0;
  local_2c8._16_8_ = (pointer)0x0;
  psVar15 = config;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_2c8,config
            );
  pcVar2 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  local_4b0 = &this->Configs;
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_4b0,fileConfig);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_2c8
             ,&((pmVar17->MacOSXContentGenerator)._M_t.
                super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
               _M_head_impl)->super_MacOSXContentGeneratorType,config);
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ - local_2c8._0_8_);
  }
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_8_ = (cmSourceFile *)0x0;
  local_2c8._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_2c8,config
            );
  pcVar2 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_4b0,fileConfig);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_2c8
             ,&((pmVar17->MacOSXContentGenerator)._M_t.
                super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
               _M_head_impl)->super_MacOSXContentGeneratorType,config);
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ - local_2c8._0_8_);
  }
  local_3ec = (undefined4)CONCAT71(in_register_00000009,firstForConfig);
  pcVar40 = this;
  if (firstForConfig) {
    pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
    local_2c8._0_8_ = local_2c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"CMAKE_PCH_EXTENSION","");
    cVar18 = cmMakefile::GetDefinition(pcVar3,(string *)local_2c8);
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    local_3e8._0_8_ = (cmCustomCommand *)0x0;
    local_3e8._8_8_ = (cmCustomCommand *)0x0;
    local_3e8._16_8_ = (pointer)0x0;
    cmGeneratorTarget::GetExternalObjects
              ((this->super_cmCommonTargetGenerator).GeneratorTarget,
               (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_3e8,
               config);
    uVar6 = local_3e8._8_8_;
    if (local_3e8._0_8_ != local_3e8._8_8_) {
      pcVar36 = (cmCustomCommand *)local_3e8._0_8_;
      do {
        pcVar24 = (cmSourceFile *)
                  (pcVar36->Outputs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
        psVar19 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar24);
        pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
        psVar19 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar20,psVar19);
        (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x18])((value_type *)local_2c8,pcVar14,psVar19,psVar15);
        local_4a8._0_8_ = local_2c8._8_8_;
        local_4a8._8_8_ = local_2c8._0_8_;
        if (cVar18.Value == (string *)0x0) {
LAB_004f6e59:
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                    ::operator[](local_4b0,psVar15);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pmVar17->Objects,(value_type *)local_2c8);
        }
        else {
          pcVar24 = (cmSourceFile *)(cVar18.Value)->_M_string_length;
          if (((ulong)local_2c8._8_8_ < pcVar24) ||
             (__str._M_str = ((cVar18.Value)->_M_dataplus)._M_p, __str._M_len = (size_t)pcVar24,
             iVar12 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_4a8,
                                 local_2c8._8_8_ - (long)pcVar24,(size_type)pcVar24,__str),
             iVar12 != 0)) goto LAB_004f6e59;
        }
        if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
          operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
        }
        pcVar36 = (cmCustomCommand *)
                  &(pcVar36->Outputs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while (pcVar36 != (cmCustomCommand *)uVar6);
    }
    if ((cmCustomCommand *)local_3e8._0_8_ != (cmCustomCommand *)0x0) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ - local_3e8._0_8_);
    }
  }
  pcVar41 = pcVar40;
  pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
  bVar10 = cmGlobalNinjaGenerator::SupportsCWDDepend(pcVar14);
  psVar19 = psVar15;
  if (!bVar10) {
    GetObjectFileDir((string *)local_2c8,pcVar40,psVar15);
    EnsureDirectoryExists(pcVar40,(string *)local_2c8);
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
  }
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"phony","");
  local_3e8._0_8_ = local_3e8 + 0x10;
  local_3e8._8_8_ = (pointer)0x0;
  local_3e8._16_8_ = local_3e8._16_8_ & 0xffffffffffffff00;
  local_3c8._M_p = (pointer)&local_3b8;
  if (local_78 == &local_68) {
    local_3b8._8_8_ = local_68._8_8_;
  }
  else {
    local_3c8._M_p = (pointer)local_78;
  }
  local_3b8._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
  local_3b8._M_local_buf[0] = local_68._M_local_buf[0];
  local_3c0 = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_310._M_color = _S_red;
  local_310._M_parent = (_Base_ptr)0x0;
  local_78 = &local_68;
  memset(&local_3a8,0,0x90);
  local_2f0 = 0;
  local_2e8._M_p = (pointer)&local_2d8;
  local_2e0 = 0;
  local_2d8._M_local_buf[0] = '\0';
  local_310._M_left = &local_310;
  local_310._M_right = &local_310;
  psVar21 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((pcVar40->super_cmCommonTargetGenerator).GeneratorTarget);
  local_468._0_8_ = local_468 + 0x10;
  pcVar1 = (psVar21->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_468,pcVar1,pcVar1 + psVar21->_M_string_length);
  local_2c8._0_8_ = (pointer)0x1c;
  local_2c8._8_8_ = "Order-only phony target for ";
  local_2c8._16_8_ = (pointer)0x0;
  local_2b0._0_8_ = local_468._8_8_;
  local_2b0._8_8_ = local_468._0_8_;
  views._M_len = 2;
  views._M_array = (iterator)local_2c8;
  local_2a0._M_p = (pointer)local_468;
  cmCatViews((string *)local_4a8,views);
  std::__cxx11::string::operator=((string *)local_3e8,(string *)local_4a8);
  if ((cmSourceFile *)local_4a8._0_8_ != (cmSourceFile *)(local_4a8 + 0x10)) {
    operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_468 + 0x10)) {
    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
  }
  pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
  (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (local_2c8,pcVar14,(pcVar40->super_cmCommonTargetGenerator).GeneratorTarget,psVar15);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             local_3a8._M_local_buf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  local_4d8._16_8_ = (pointer)0x0;
  local_4d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_4d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_428._16_8_ = (pointer)0x0;
  local_428._0_8_ = (_Base_ptr)0x0;
  local_428._8_8_ = (_Base_ptr)0x0;
  bVar10 = cmTarget::HasFileSets(((pcVar40->super_cmCommonTargetGenerator).GeneratorTarget)->Target)
  ;
  local_430 = (_Rb_tree_node_base *)CONCAT71(local_430._1_7_,1);
  if (bVar10) {
    PVar13 = cmPolicies::PolicyMap::Get
                       (&((pcVar40->super_cmCommonTargetGenerator).GeneratorTarget)->PolicyMap,
                        CMP0154);
    local_430 = (_Rb_tree_node_base *)
                CONCAT71(local_430._1_7_,PVar13 + ~REQUIRED_ALWAYS < 0xfffffffd);
  }
  local_e0 = (_Rb_tree_node_base *)iStack_400._M_current;
  if (local_408 != (_Rb_tree_node_base *)iStack_400._M_current) {
    p_Var31 = local_408;
    do {
      pcVar36 = *(cmCustomCommand **)p_Var31;
      local_100._M_allocated_capacity = (size_type)&local_f0;
      pcVar1 = (psVar19->_M_dataplus)._M_p;
      local_470 = p_Var31;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar1,pcVar1 + psVar19->_M_string_length);
      local_128 = false;
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_48 = (code *)0x0;
      uStack_40 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = psVar19;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_58;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)pcVar41;
      computeInternalDepfile._M_invoker = (_Invoker_type)fileConfig;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_2c8,pcVar36,(string *)&local_100,
                 (cmLocalGenerator *)pcVar41->LocalGenerator,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_148,computeInternalDepfile);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      if ((local_128 == true) &&
         (local_128 = false,
         local_148._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_148._M_value + 0x10))) {
        operator_delete((void *)local_148._M_value._M_dataplus._M_p,local_148._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_allocated_capacity != &local_f0) {
        operator_delete((void *)local_100._M_allocated_capacity,local_f0._M_allocated_capacity + 1);
      }
      pvVar22 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                          ((cmCustomCommandGenerator *)local_2c8);
      pvVar23 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)local_2c8);
      lVar32 = local_4d8._8_8_ - local_4d8._0_8_;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_4d8,
                 local_4d8._8_8_,
                 (pvVar22->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar22->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_4d8,
                 local_4d8._8_8_,
                 (pvVar23->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar23->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      iVar33._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_4d8._0_8_ + lVar32);
      if (iVar33._M_current !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8._8_8_ &&
          (char)local_430 == '\0') {
        do {
          pcVar4 = (pcVar41->super_cmCommonTargetGenerator).GeneratorTarget;
          pcVar24 = cmMakefile::GetOrCreateGeneratedSource
                              ((pcVar41->super_cmCommonTargetGenerator).Makefile,iVar33._M_current);
          pcVar25 = cmGeneratorTarget::GetFileSetForSource(pcVar4,psVar19,pcVar24);
          if (pcVar25 == (cmFileSet *)0x0) {
            bVar10 = true;
LAB_004f739d:
            if ((pcVar25 != (cmFileSet *)0x0 & (bVar10 ^ 1U)) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_428,iVar33._M_current);
            }
            iVar33 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_4d8,iVar33);
          }
          else {
            bVar11 = cmFileSetVisibilityIsForInterface(pcVar25->Visibility);
            bVar10 = cmFileSetTypeCanBeIncluded(&pcVar25->Type);
            if (!bVar11 || !bVar10) goto LAB_004f739d;
            iVar33._M_current = iVar33._M_current + 1;
          }
        } while (iVar33._M_current !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4d8._8_8_);
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_2c8);
      p_Var31 = (_Rb_tree_node_base *)&local_470->_M_parent;
    } while (p_Var31 != local_e0);
  }
  pcVar40 = pcVar41;
  cmLocalNinjaGenerator::AppendTargetDepends
            (pcVar41->LocalGenerator,(pcVar41->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_330,psVar19,fileConfig,DependOnTargetOrdering);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_4b0,psVar19);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_330,
             local_328._M_current,
             (pmVar17->ExtraFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pmVar17->ExtraFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  uVar7 = local_4d8._8_8_;
  uVar6 = local_4d8._0_8_;
  MVar26.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )uVar6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )uVar7,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_330,MVar26);
  iVar33._M_current = local_328._M_current;
  pbVar9 = local_330;
  if (local_330 != local_328._M_current) {
    uVar27 = (long)local_328._M_current - (long)local_330 >> 5;
    lVar32 = 0x3f;
    if (uVar27 != 0) {
      for (; uVar27 >> lVar32 == 0; lVar32 = lVar32 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_330,local_328._M_current,((uint)lVar32 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar9,iVar33._M_current);
  }
  _Var28 = std::
           __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (local_330,local_328._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_330,(iterator)_Var28._M_current,local_328);
  if (local_330 == local_328._M_current) {
    local_468._0_8_ = local_468 + 0x10;
    local_468._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_468._16_8_ = local_468._16_8_ & 0xffffffffffffff00;
    pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
    bVar10 = cmGlobalNinjaGenerator::SupportsCWDDepend(pcVar14);
    if (bVar10) {
      std::__cxx11::string::_M_replace((ulong)local_468,0,(char *)local_468._8_8_,0x934aed);
    }
    else {
      psVar15 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)pcVar41->LocalGenerator);
      (*(pcVar41->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[0x10])
                (&local_168,pcVar41->LocalGenerator,
                 (pcVar41->super_cmCommonTargetGenerator).GeneratorTarget);
      local_2c8._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_2c8._0_8_ = psVar15->_M_string_length;
      local_2c8._16_8_ = (pointer)0x0;
      local_4a8._16_8_ = local_490;
      local_4a8._0_8_ = (cmSourceFile *)0x0;
      local_4a8._8_8_ = &DAT_00000001;
      local_490[0]._M_local_buf[0] = '/';
      local_2b0._0_8_ = &DAT_00000001;
      local_2a0._M_p = (pointer)0x0;
      local_298 = (undefined1  [8])local_168._M_string_length;
      auStack_290._0_8_ = local_168._M_dataplus._M_p;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_2c8;
      local_2b0._8_8_ = local_4a8._16_8_;
      auStack_290._8_8_ = &local_168;
      cmCatViews(&local_98,views_00);
      std::__cxx11::string::operator=((string *)local_468,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
    psVar15 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar14,(string *)local_468);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_330,psVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_468 + 0x10)) {
      operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
    }
  }
  pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
  pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
  iVar12 = (*(pcVar20->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x45])(pcVar20,fileConfig);
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar14,(ostream *)CONCAT44(extraout_var_01,iVar12),(cmNinjaBuild *)local_3e8,0,
             (bool *)0x0);
  pcVar41->HasPrivateGeneratedSources = local_428._0_8_ != local_428._8_8_;
  if (local_428._0_8_ != local_428._8_8_) {
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"phony","");
    local_2b0._8_8_ = local_298;
    local_2c8._0_8_ = local_2c8 + 0x10;
    local_2c8._8_8_ = (pointer)0x0;
    local_2c8._16_8_ = local_2c8._16_8_ & 0xffffffffffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity == &local_a8) {
      auStack_290._0_8_ = local_a8._8_8_;
    }
    else {
      local_2b0._8_8_ = local_b8._M_allocated_capacity;
    }
    local_298._1_7_ = local_a8._M_allocated_capacity._1_7_;
    local_298[0] = local_a8._M_local_buf[0];
    local_2a0._M_p = (pointer)local_b8._8_8_;
    local_b8._8_8_ = (string *)0x0;
    local_a8._M_local_buf[0] = '\0';
    local_1f0._M_dataplus._M_p._0_4_ = _S_red;
    local_1f0._M_string_length = 0;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(auStack_290 + 8),0,
           0x90);
    local_1d0 = 0;
    local_1c8._M_allocated_capacity = (size_type)local_1b8;
    local_1c8._8_8_ = 0;
    local_1b8[0]._M_local_buf[0] = '\0';
    local_1f0.field_2._M_allocated_capacity = (size_type)&local_1f0;
    local_1f0.field_2._8_8_ = &local_1f0;
    pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
    (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49]
    )(local_4a8,pcVar14,(pcVar41->super_cmCommonTargetGenerator).GeneratorTarget,psVar19);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_210,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8);
    if ((cmSourceFile *)local_4a8._0_8_ != (cmSourceFile *)(local_4a8 + 0x10)) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
    }
    pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
    cmGlobalNinjaGenerator::OrderDependsTargetForTargetPrivate
              ((string *)local_4a8,pcVar14,(pcVar41->super_cmCommonTargetGenerator).GeneratorTarget,
               psVar19);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (auStack_290 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8);
    if ((cmSourceFile *)local_4a8._0_8_ != (cmSourceFile *)(local_4a8 + 0x10)) {
      operator_delete((void *)local_4a8._0_8_,(ulong)(local_4a8._16_8_ + 1));
    }
    uVar7 = local_428._8_8_;
    uVar6 = local_428._0_8_;
    MVar26.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )uVar6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )uVar7,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_210,MVar26);
    iVar33._M_current = local_208._M_current;
    pbVar9 = local_210;
    if (local_210 != local_208._M_current) {
      uVar27 = (long)local_208._M_current - (long)local_210 >> 5;
      lVar32 = 0x3f;
      if (uVar27 != 0) {
        for (; uVar27 >> lVar32 == 0; lVar32 = lVar32 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_210,local_208._M_current,((uint)lVar32 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar9,iVar33._M_current);
    }
    _Var28 = std::
             __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (local_210,local_208._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_210,(iterator)_Var28._M_current,local_208);
    pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
    pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar41->LocalGenerator);
    iVar12 = (*(pcVar20->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[0x45])(pcVar20,fileConfig);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar14,(ostream *)CONCAT44(extraout_var_02,iVar12),(cmNinjaBuild *)local_2c8,0,
               (bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_2c8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4d8);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_3e8);
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_8_ = (pointer)0x0;
  local_2c8._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((pcVar41->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_2c8,
             psVar19);
  uVar6 = local_2c8._8_8_;
  local_3e8._0_8_ = (cmCustomCommand *)0x0;
  local_3e8._8_8_ = (cmSourceFile **)0x0;
  local_3e8._16_8_ = (cmSourceFile **)0x0;
  bVar10 = local_3ec._0_1_;
  if (local_2c8._0_8_ != local_2c8._8_8_) {
    ppcVar38 = (pointer)local_2c8._0_8_;
    do {
      local_4a8._0_8_ = *ppcVar38;
      bVar11 = cmLocalGenerator::IsSplitSwiftBuild((cmLocalGenerator *)pcVar40->LocalGenerator);
      if (bVar11) {
        cmSourceFile::GetLanguage_abi_cxx11_(&local_98,(cmSourceFile *)local_4a8._0_8_);
        iVar12 = std::__cxx11::string::compare((char *)&local_98);
        bVar11 = iVar12 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar11 = false;
      }
      if (bVar11) {
        if (local_3e8._8_8_ == local_3e8._16_8_) {
          std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>::
          _M_realloc_insert<cmSourceFile_const*const&>
                    ((vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>> *)local_3e8,
                     (iterator)local_3e8._8_8_,(cmSourceFile **)local_4a8);
        }
        else {
          *(undefined8 *)local_3e8._8_8_ = local_4a8._0_8_;
          local_3e8._8_8_ = local_3e8._8_8_ + 8;
        }
      }
      else {
        WriteObjectBuildStatement(pcVar40,(cmSourceFile *)local_4a8._0_8_,psVar19,fileConfig,bVar10)
        ;
      }
      ppcVar38 = ppcVar38 + 1;
    } while (ppcVar38 != (pointer)uVar6);
  }
  pcVar41 = pcVar40;
  WriteSwiftObjectBuildStatement
            (pcVar40,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                     local_3e8,psVar19,fileConfig,bVar10);
  if ((cmCustomCommand *)local_3e8._0_8_ != (cmCustomCommand *)0x0) {
    operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ - local_3e8._0_8_);
  }
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ - local_2c8._0_8_);
  }
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_8_ = (pointer)0x0;
  local_2c8._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetCxxModuleSources
            ((pcVar40->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_2c8,
             psVar19);
  uVar6 = local_2c8._8_8_;
  for (ppcVar38 = (pointer)local_2c8._0_8_; ppcVar38 != (pointer)uVar6; ppcVar38 = ppcVar38 + 1) {
    WriteCxxModuleBmiBuildStatement(pcVar40,*ppcVar38,psVar19,fileConfig,bVar10);
  }
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ - local_2c8._0_8_);
  }
  local_4a8._0_8_ = (char *)0x0;
  local_4a8._8_8_ = (pointer)0x0;
  local_4a8._16_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  cmGeneratorTarget::GetSourceFiles
            ((pcVar40->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_4a8,psVar19);
  uVar6 = local_4a8._8_8_;
  for (ppcVar37 = (pointer)local_4a8._0_8_; ppcVar37 != (pointer)uVar6; ppcVar37 = ppcVar37 + 1) {
    pcVar24 = *ppcVar37;
    pcVar25 = cmGeneratorTarget::GetFileSetForSource
                        ((pcVar41->super_cmCommonTargetGenerator).GeneratorTarget,psVar19,pcVar24);
    if (((pcVar25 != (cmFileSet *)0x0) && ((pcVar25->Type)._M_string_length == 0xb)) &&
       (iVar12 = bcmp((pcVar25->Type)._M_dataplus._M_p,"CXX_MODULES",0xb), iVar12 == 0)) {
      cmSourceFile::GetLanguage_abi_cxx11_((string *)local_2c8,pcVar24);
      uVar7 = local_2c8._8_8_;
      if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
        operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
      }
      if ((pointer)uVar7 == (pointer)0x0) {
        pcVar4 = (pcVar41->super_cmCommonTargetGenerator).GeneratorTarget;
        pcVar3 = pcVar4->Makefile;
        psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
        psVar21 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar24);
        local_2c8._0_8_ = (pointer)0x8;
        local_2c8._8_8_ = "Target \"";
        local_2c8._16_8_ = (pointer)0x0;
        local_2b0._8_8_ = (psVar15->_M_dataplus)._M_p;
        local_2b0._M_allocated_capacity = psVar15->_M_string_length;
        local_2a0._M_p = (pointer)0x0;
        local_298 = (undefined1  [8])0x14;
        auStack_290._0_8_ = "\" has source file\n  ";
        auStack_290._8_8_ = (key_type *)0x0;
        local_278 = (pointer)(psVar21->_M_dataplus)._M_p;
        local_280._M_p = (pointer)psVar21->_M_string_length;
        local_270._M_allocated_capacity = 0;
        local_270._8_8_ = 0x4a;
        local_260 = (cmLocalGenerator *)0x964f07;
        local_258 = (pointer)0x0;
        views_01._M_len = 5;
        views_01._M_array = (iterator)local_2c8;
        cmCatViews((string *)local_3e8,views_01);
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_3e8);
        if ((cmCustomCommand *)local_3e8._0_8_ != (cmCustomCommand *)(local_3e8 + 0x10)) {
          operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
        }
      }
    }
  }
  if ((char *)local_4a8._0_8_ != (char *)0x0) {
    operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ - local_4a8._0_8_);
  }
  pcVar40 = pcVar41;
  bVar10 = cmGeneratorTarget::HaveFortranSources
                     ((pcVar41->super_cmCommonTargetGenerator).GeneratorTarget,psVar19);
  if (bVar10) {
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
              ::operator[](local_4b0,psVar19);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Fortran","");
    cVar29 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
             ::find(&(pmVar17->ScanningInfo)._M_t,&local_168);
    bVar10 = (_Rb_tree_header *)cVar29._M_node ==
             &(pmVar17->ScanningInfo)._M_t._M_impl.super__Rb_tree_header;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar10 = false;
  }
  if (bVar10) {
    local_2c8._0_8_ = local_2c8 + 0x10;
    local_2c8._8_8_ = (pointer)0x0;
    local_2c8._16_8_ = local_2c8._16_8_ & 0xffffffffffffff00;
    local_2a0._M_p = (pointer)0x0;
    local_298 = (undefined1  [8])((ulong)local_298 & 0xffffffffffffff00);
    local_2b0._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_298;
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
              ::operator[](local_4b0,psVar19);
    local_3e8._0_8_ = local_3e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Fortran","");
    this_00 = (vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmNinjaTargetGenerator::ScanningFiles,_std::allocator<cmNinjaTargetGenerator::ScanningFiles>_>_>_>_>
                 ::operator[](&pmVar17->ScanningInfo,(key_type *)local_3e8);
    std::
    vector<cmNinjaTargetGenerator::ScanningFiles,std::allocator<cmNinjaTargetGenerator::ScanningFiles>>
    ::emplace_back<cmNinjaTargetGenerator::ScanningFiles&>(this_00,(ScanningFiles *)local_2c8);
    if ((cmCustomCommand *)local_3e8._0_8_ != (cmCustomCommand *)(local_3e8 + 0x10)) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    }
    local_3e8._0_8_ = local_3e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Fortran","");
    WriteCompileRule(pcVar41,(string *)local_3e8,psVar19,Yes);
    if ((cmCustomCommand *)local_3e8._0_8_ != (cmCustomCommand *)(local_3e8 + 0x10)) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298) {
      operator_delete((void *)local_2b0._8_8_,(long)local_298 + 1);
    }
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
  }
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](local_4b0,psVar19);
  p_Var30 = (pmVar17->ScanningInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var31 = &(pmVar17->ScanningInfo)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var30 != p_Var31) {
    do {
      local_430 = p_Var31;
      LanguageDyndepRule(&local_d8,pcVar40,(string *)(p_Var30 + 1),psVar19);
      local_2c8._0_8_ = local_2c8 + 0x10;
      local_2c8._8_8_ = (pointer)0x0;
      local_2c8._16_8_ = local_2c8._16_8_ & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
        auStack_290._0_8_ = local_d8.field_2._8_8_;
        local_2b0._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_298;
      }
      else {
        local_2b0._8_8_ = local_d8._M_dataplus._M_p;
      }
      local_298._1_7_ = local_d8.field_2._M_allocated_capacity._1_7_;
      local_298[0] = local_d8.field_2._M_local_buf[0];
      local_2a0._M_p = (pointer)local_d8._M_string_length;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_1f0._M_dataplus._M_p._0_4_ = _S_red;
      local_1f0._M_string_length = 0;
      local_470 = p_Var30 + 1;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(auStack_290 + 8),
             0,0x90);
      local_1f0.field_2._M_allocated_capacity = (size_type)&local_1f0;
      local_1d0 = 0;
      local_1c8._M_allocated_capacity = (size_type)local_1b8;
      local_1c8._8_8_ = 0;
      local_1b8[0]._M_local_buf[0] = '\0';
      local_1f0.field_2._8_8_ = local_1f0.field_2._M_allocated_capacity;
      GetDyndepFilePath((string *)local_3e8,pcVar40,(string *)local_470,psVar19);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (auStack_290 + 8),(string *)local_3e8);
      psVar15 = psVar19;
      if ((cmCustomCommand *)local_3e8._0_8_ != (cmCustomCommand *)(local_3e8 + 0x10)) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
        psVar15 = psVar19;
      }
      pcVar41 = pcVar40;
      psVar19 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                          ((pcVar40->super_cmCommonTargetGenerator).Makefile);
      (*(pcVar40->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[0x10])
                (local_428,pcVar40->LocalGenerator,
                 (pcVar40->super_cmCommonTargetGenerator).GeneratorTarget);
      pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
      (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
        [0x4d])((pointer)local_120,pcVar14,psVar15);
      local_3e8._8_8_ = (psVar19->_M_dataplus)._M_p;
      local_3e8._0_8_ = psVar19->_M_string_length;
      local_3e8._16_8_ = (cmSourceFile **)0x0;
      local_4a8._0_8_ = (char *)0x0;
      local_4a8._8_8_ = &DAT_00000001;
      local_4a8._16_8_ = local_490;
      local_490[0]._M_local_buf[0] = '/';
      local_3e8._24_8_ = &DAT_00000001;
      local_3c0 = 0;
      local_3b8._M_allocated_capacity = local_428._8_8_;
      local_3b8._8_8_ = local_428._0_8_;
      local_3a8._M_allocated_capacity = (size_type)local_428;
      local_3a8._8_8_ = local_120._8_8_;
      local_398 = (pointer)local_120._0_8_;
      local_468._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_468._8_8_ = &DAT_00000001;
      local_468._16_8_ = &local_450;
      local_450._M_dataplus._M_p._0_1_ = '/';
      local_388 = (pointer)&DAT_00000001;
      local_378 = (pointer)0x0;
      local_368 = *(pointer *)(p_Var30 + 1);
      local_370 = p_Var30[1]._M_parent;
      local_360 = (pointer)0x0;
      local_358 = (pointer)0xc;
      local_350 = (pointer)0x963c2e;
      local_348 = (pointer)0x0;
      views_02._M_len = 7;
      views_02._M_array = (iterator)local_3e8;
      local_3c8._M_p = (pointer)local_4a8._16_8_;
      local_390 = (pointer)local_120;
      local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_468._16_8_;
      cmCatViews((string *)local_4d8,views_02);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_270._M_local_buf,(string *)local_4d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4d8 + 0x10)) {
        operator_delete((void *)local_4d8._0_8_,(ulong)(local_4d8._16_8_ + 1));
      }
      if ((pointer)local_120._0_8_ != (pointer)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      if ((_Base_ptr)local_428._0_8_ != (_Base_ptr)(local_428 + 0x10)) {
        operator_delete((void *)local_428._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_428._16_8_)->_M_p + 1));
      }
      GetTargetDependInfoPath((string *)local_3e8,pcVar41,(string *)local_470,psVar15);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_228,(string *)local_3e8);
      if ((cmCustomCommand *)local_3e8._0_8_ != (cmCustomCommand *)(local_3e8 + 0x10)) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      p_Var5 = p_Var30[2]._M_parent;
      if (*(_Base_ptr *)(p_Var30 + 2) != p_Var5) {
        __x = *(_Base_ptr *)(p_Var30 + 2) + 1;
        do {
          if (__x[-1]._M_parent != (_Base_ptr)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_240,(value_type *)(__x + -1));
          }
          if (__x->_M_parent != (_Base_ptr)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_270,(value_type *)__x);
          }
          p_Var39 = __x + 1;
          __x = __x + 2;
        } while (p_Var39 != p_Var5);
      }
      p_Var31 = local_470;
      psVar19 = psVar15;
      pcVar40 = pcVar41;
      WriteTargetDependInfo(pcVar41,(string *)local_470,psVar15);
      cmCommonTargetGenerator::GetLinkedTargetDirectories
                ((LinkedTargetDirs *)local_468,&pcVar41->super_cmCommonTargetGenerator,
                 (string *)p_Var31,psVar15);
      uVar6 = local_468._8_8_;
      for (paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_468._0_8_; sVar8 = local_450._M_string_length,
          paVar34 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar6; paVar34 = paVar34 + 2) {
        local_3e8._8_8_ = paVar34->_M_allocated_capacity;
        local_3e8._0_8_ = *(undefined8 *)(paVar34->_M_local_buf + 8);
        local_3e8._16_8_ = (cmSourceFile **)0x0;
        local_4a8._0_8_ = (char *)0x0;
        local_4a8._8_8_ = &DAT_00000001;
        local_4a8._16_8_ = local_490;
        local_490[0]._M_local_buf[0] = '/';
        local_3e8._24_8_ = &DAT_00000001;
        local_3c0 = 0;
        local_3b8._8_8_ = *(undefined8 *)(p_Var30 + 1);
        local_3b8._M_allocated_capacity = (size_type)p_Var30[1]._M_parent;
        local_3a8._M_allocated_capacity = 0;
        local_3a8._8_8_ = 0xc;
        local_398 = (pointer)0x963c2e;
        local_390 = (pointer)0x0;
        views_03._M_len = 4;
        views_03._M_array = (iterator)local_3e8;
        local_3c8._M_p = (pointer)local_4a8._16_8_;
        cmCatViews((string *)local_4d8,views_03);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_228,(string *)local_4d8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4d8 + 0x10))
        {
          operator_delete((void *)local_4d8._0_8_,(ulong)(local_4d8._16_8_ + 1));
        }
      }
      for (pbVar35 = (pointer)CONCAT71(local_450._M_dataplus._M_p._1_7_,
                                       local_450._M_dataplus._M_p._0_1_); pbVar35 != (pointer)sVar8;
          pbVar35 = pbVar35 + 1) {
        local_3e8._8_8_ = (pbVar35->_M_dataplus)._M_p;
        local_3e8._0_8_ = pbVar35->_M_string_length;
        local_3e8._16_8_ = (cmSourceFile **)0x0;
        local_4a8._0_8_ = (char *)0x0;
        local_4a8._8_8_ = &DAT_00000001;
        local_4a8._16_8_ = local_490;
        local_490[0]._M_local_buf[0] = '/';
        local_3e8._24_8_ = &DAT_00000001;
        local_3c0 = 0;
        local_3b8._8_8_ = *(undefined8 *)(p_Var30 + 1);
        local_3b8._M_allocated_capacity = (size_type)p_Var30[1]._M_parent;
        local_3a8._M_allocated_capacity = 0;
        local_3a8._8_8_ = 0xc;
        local_398 = (pointer)0x963c2e;
        local_390 = (pointer)0x0;
        views_04._M_len = 4;
        views_04._M_array = (iterator)local_3e8;
        local_3c8._M_p = (pointer)local_4a8._16_8_;
        cmCatViews((string *)local_4d8,views_04);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_228,(string *)local_4d8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4d8 + 0x10))
        {
          operator_delete((void *)local_4d8._0_8_,(ulong)(local_4d8._16_8_ + 1));
        }
      }
      pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
      pcVar20 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
      iVar12 = (*(pcVar20->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator[0x45])(pcVar20,fileConfig);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar14,(ostream *)CONCAT44(extraout_var_03,iVar12),(cmNinjaBuild *)local_2c8,0,
                 (bool *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_450);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_468);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_2c8);
      p_Var30 = (_Base_ptr)std::_Rb_tree_increment(p_Var30);
      p_Var31 = local_430;
    } while (p_Var30 != local_430);
  }
  pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar40->LocalGenerator);
  iVar12 = (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x45])(pcVar14,fileConfig);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT44(extraout_var_04,iVar12),"\n",1);
  if (local_408 != (_Rb_tree_node_base *)0x0) {
    operator_delete(local_408,(long)local_3f8 - (long)local_408);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatements(
  const std::string& config, const std::string& fileConfig,
  bool firstForConfig)
{
  this->GeneratorTarget->CheckCxxModuleStatus(config);

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetImplFileStream(fileConfig));
  this->GetImplFileStream(fileConfig)
    << "# Object build statements for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";

  std::vector<cmCustomCommand const*> customCommands;
  {
    std::vector<cmSourceFile const*> customCommandSources;
    this->GeneratorTarget->GetCustomCommands(customCommandSources, config);
    for (cmSourceFile const* sf : customCommandSources) {
      cmCustomCommand const* cc = sf->GetCustomCommand();
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());
      customCommands.push_back(cc);
    }
  }
  {
    std::vector<cmSourceFile const*> headerSources;
    this->GeneratorTarget->GetHeaderSources(headerSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      headerSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  {
    std::vector<cmSourceFile const*> extraSources;
    this->GeneratorTarget->GetExtraSources(extraSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      extraSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  if (firstForConfig) {
    cmValue pchExtension =
      this->GetMakefile()->GetDefinition("CMAKE_PCH_EXTENSION");

    std::vector<cmSourceFile const*> externalObjects;
    this->GeneratorTarget->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* sf : externalObjects) {
      auto objectFileName = this->GetGlobalGenerator()->ExpandCFGIntDir(
        this->ConvertToNinjaPath(sf->GetFullPath()), config);
      if (!cmHasSuffix(objectFileName, pchExtension)) {
        this->Configs[config].Objects.push_back(objectFileName);
      }
    }
  }

  if (!this->GetGlobalGenerator()->SupportsCWDDepend()) {
    // Ensure that the object directory exists. If there are no objects in the
    // target (e.g., an empty `OBJECT` library), the directory is still listed
    // as an order-only depends in the build files. Alternate `ninja`
    // implementations may not allow this (such as `samu`). See #25526.
    auto const objectDir = this->GetObjectFileDir(config);
    this->EnsureDirectoryExists(objectDir);
  }

  {
    cmNinjaBuild build("phony");
    build.Comment =
      cmStrCat("Order-only phony target for ", this->GetTargetName());
    build.Outputs.push_back(this->OrderDependsTargetForTarget(config));

    // Gather order-only dependencies on custom command outputs.
    std::vector<std::string> ccouts;
    std::vector<std::string> ccouts_private;
    bool usePrivateGeneratedSources = false;
    if (this->GeneratorTarget->Target->HasFileSets()) {
      switch (this->GetGeneratorTarget()->GetPolicyStatusCMP0154()) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::NEW:
          usePrivateGeneratedSources = true;
          break;
      }
    }
    for (cmCustomCommand const* cc : customCommands) {
      cmCustomCommandGenerator ccg(*cc, config, this->GetLocalGenerator());
      const std::vector<std::string>& ccoutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccbyproducts = ccg.GetByproducts();
      auto const nPreviousOutputs = ccouts.size();
      ccouts.insert(ccouts.end(), ccoutputs.begin(), ccoutputs.end());
      ccouts.insert(ccouts.end(), ccbyproducts.begin(), ccbyproducts.end());
      if (usePrivateGeneratedSources) {
        auto it = ccouts.begin();
        // Skip over outputs that were already detected.
        std::advance(it, nPreviousOutputs);
        while (it != ccouts.end()) {
          cmFileSet const* fileset =
            this->GeneratorTarget->GetFileSetForSource(
              config, this->Makefile->GetOrCreateGeneratedSource(*it));
          bool isVisible = fileset &&
            cmFileSetVisibilityIsForInterface(fileset->GetVisibility());
          bool isIncludeable =
            !fileset || cmFileSetTypeCanBeIncluded(fileset->GetType());
          if (fileset && isVisible && isIncludeable) {
            ++it;
            continue;
          }
          if (!fileset || isIncludeable) {
            ccouts_private.push_back(*it);
          }
          it = ccouts.erase(it);
        }
      }
    }

    cmNinjaDeps& orderOnlyDeps = build.OrderOnlyDeps;
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, orderOnlyDeps, config, fileConfig,
      DependOnTargetOrdering);

    // Add order-only dependencies on other files associated with the target.
    cm::append(orderOnlyDeps, this->Configs[config].ExtraFiles);

    // Add order-only dependencies on custom command outputs.
    std::transform(ccouts.begin(), ccouts.end(),
                   std::back_inserter(orderOnlyDeps), this->MapToNinjaPath());

    std::sort(orderOnlyDeps.begin(), orderOnlyDeps.end());
    orderOnlyDeps.erase(
      std::unique(orderOnlyDeps.begin(), orderOnlyDeps.end()),
      orderOnlyDeps.end());

    // The phony target must depend on at least one input or ninja will explain
    // that "output ... of phony edge with no inputs doesn't exist" and
    // consider the phony output "dirty".
    if (orderOnlyDeps.empty()) {
      std::string tgtDir;
      if (this->GetGlobalGenerator()->SupportsCWDDepend()) {
        tgtDir = ".";
      } else {
        // Any path that always exists will work here.
        tgtDir = cmStrCat(
          this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
          this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
      }
      orderOnlyDeps.push_back(this->ConvertToNinjaPath(tgtDir));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);

    // Add order-only dependencies on custom command outputs that are
    // private to this target.
    this->HasPrivateGeneratedSources = !ccouts_private.empty();
    if (this->HasPrivateGeneratedSources) {
      cmNinjaBuild buildPrivate("phony");
      cmNinjaDeps& orderOnlyDepsPrivate = buildPrivate.OrderOnlyDeps;
      orderOnlyDepsPrivate.push_back(
        this->OrderDependsTargetForTarget(config));

      buildPrivate.Outputs.push_back(
        this->OrderDependsTargetForTargetPrivate(config));

      std::transform(ccouts_private.begin(), ccouts_private.end(),
                     std::back_inserter(orderOnlyDepsPrivate),
                     this->MapToNinjaPath());

      std::sort(orderOnlyDepsPrivate.begin(), orderOnlyDepsPrivate.end());
      orderOnlyDepsPrivate.erase(
        std::unique(orderOnlyDepsPrivate.begin(), orderOnlyDepsPrivate.end()),
        orderOnlyDepsPrivate.end());

      this->GetGlobalGenerator()->WriteBuild(
        this->GetImplFileStream(fileConfig), buildPrivate);
    }
  }
  {
    std::vector<cmSourceFile const*> objectSources;
    this->GeneratorTarget->GetObjectSources(objectSources, config);

    std::vector<cmSourceFile const*> swiftSources;

    for (cmSourceFile const* sf : objectSources) {
      if (this->GetLocalGenerator()->IsSplitSwiftBuild() &&
          sf->GetLanguage() == "Swift") {
        swiftSources.push_back(sf);
      } else {
        this->WriteObjectBuildStatement(sf, config, fileConfig,
                                        firstForConfig);
      }
    }
    WriteSwiftObjectBuildStatement(swiftSources, config, fileConfig,
                                   firstForConfig);
  }

  {
    std::vector<cmSourceFile const*> bmiOnlySources;
    this->GeneratorTarget->GetCxxModuleSources(bmiOnlySources, config);

    for (cmSourceFile const* sf : bmiOnlySources) {
      this->WriteCxxModuleBmiBuildStatement(sf, config, fileConfig,
                                            firstForConfig);
    }
  }

  // Detect sources in `CXX_MODULES` which are not compiled.
  {
    std::vector<cmSourceFile*> sources;
    this->GeneratorTarget->GetSourceFiles(sources, config);
    for (cmSourceFile const* sf : sources) {
      cmFileSet const* fs =
        this->GeneratorTarget->GetFileSetForSource(config, sf);
      if (!fs) {
        continue;
      }
      if (fs->GetType() != "CXX_MODULES"_s) {
        continue;
      }
      if (sf->GetLanguage().empty()) {
        this->GeneratorTarget->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Target \"", this->GeneratorTarget->GetName(),
                   "\" has source file\n  ", sf->GetFullPath(),
                   "\nin a \"FILE_SET TYPE CXX_MODULES\" but it is not "
                   "scheduled for compilation."));
      }
    }
  }

  // Check if there are Fortran objects which need to participate in forwarding
  // module requirements.
  if (this->GeneratorTarget->HaveFortranSources(config) &&
      !this->Configs[config].ScanningInfo.count("Fortran")) {
    ScanningFiles files;
    this->Configs[config].ScanningInfo["Fortran"].emplace_back(files);
    this->WriteCompileRule("Fortran", config, WithScanning::Yes);
  }

  for (auto const& langScanningFiles : this->Configs[config].ScanningInfo) {
    std::string const& language = langScanningFiles.first;
    std::vector<ScanningFiles> const& scanningFiles = langScanningFiles.second;

    cmNinjaBuild build(this->LanguageDyndepRule(language, config));
    build.Outputs.push_back(this->GetDyndepFilePath(language, config));
    build.ImplicitOuts.emplace_back(
      cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/',
               this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
               this->GetGlobalGenerator()->ConfigDirectory(config), '/',
               language, "Modules.json"));
    build.ImplicitDeps.emplace_back(
      this->GetTargetDependInfoPath(language, config));
    for (auto const& scanFiles : scanningFiles) {
      if (!scanFiles.ScanningOutput.empty()) {
        build.ExplicitDeps.push_back(scanFiles.ScanningOutput);
      }
      if (!scanFiles.ModuleMapFile.empty()) {
        build.ImplicitOuts.push_back(scanFiles.ModuleMapFile);
      }
    }

    this->WriteTargetDependInfo(language, config);

    auto const linked_directories =
      this->GetLinkedTargetDirectories(language, config);
    for (std::string const& l : linked_directories.Direct) {
      build.ImplicitDeps.emplace_back(
        cmStrCat(l, '/', language, "Modules.json"));
    }
    for (std::string const& l : linked_directories.Forward) {
      build.ImplicitDeps.emplace_back(
        cmStrCat(l, '/', language, "Modules.json"));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);
  }

  this->GetImplFileStream(fileConfig) << "\n";
}